

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.h
# Opt level: O0

void __thiscall
Assignment::Assignment
          (Assignment *this,ptr<Operation> *operation,ptr<Expression> *left,ptr<Expression> *right)

{
  shared_ptr<Expression> local_58;
  shared_ptr<Expression> local_48;
  shared_ptr<Operation> local_38;
  ptr<Expression> *local_28;
  ptr<Expression> *right_local;
  ptr<Expression> *left_local;
  ptr<Operation> *operation_local;
  Assignment *this_local;
  
  local_28 = right;
  right_local = left;
  left_local = (ptr<Expression> *)operation;
  operation_local = (ptr<Operation> *)this;
  std::shared_ptr<Operation>::shared_ptr(&local_38,operation);
  std::shared_ptr<Expression>::shared_ptr(&local_48,left);
  std::shared_ptr<Expression>::shared_ptr(&local_58,right);
  BinaryOperator::BinaryOperator(&this->super_BinaryOperator,&local_38,&local_48,&local_58);
  std::shared_ptr<Expression>::~shared_ptr(&local_58);
  std::shared_ptr<Expression>::~shared_ptr(&local_48);
  std::shared_ptr<Operation>::~shared_ptr(&local_38);
  (this->super_BinaryOperator).super_Expression._vptr_Expression =
       (_func_int **)&PTR_evaluate_00194ae0;
  return;
}

Assistant:

Assignment(ptr<Operation> operation, ptr<Expression> left, ptr<Expression> right) : BinaryOperator(operation, left, right) { }